

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

int __thiscall
DnsStats::SubmitRecord
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,uint32_t *e_rcode,
          uint32_t *e_length,bool is_response)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  this->record_count = this->record_count + 1;
  uVar2 = SubmitName(this,packet,length,start,is_response);
  if (uVar2 + 10 <= length) {
    uVar3 = uVar2 + 10 + (uint)CONCAT11(packet[uVar2 + 8],packet[uVar2 + 9]);
    if (uVar3 <= length) {
      SubmitRecordContent(this,(uint)CONCAT11(packet[uVar2],packet[uVar2 + 1]),
                          (uint)CONCAT11(packet[uVar2 + 2],packet[uVar2 + 3]),
                          (uint)packet[uVar2 + 7] |
                          (uint)packet[uVar2 + 6] << 8 |
                          (uint)packet[uVar2 + 5] << 0x10 | (uint)packet[uVar2 + 4] << 0x18,
                          (uint)CONCAT11(packet[uVar2 + 8],packet[uVar2 + 9]),packet + uVar2 + 10,
                          packet,length,start,e_rcode,e_length,is_response);
      return uVar3;
    }
  }
  pbVar1 = (byte *)((long)&this->error_flags + 1);
  *pbVar1 = *pbVar1 | 1;
  return length;
}

Assistant:

int DnsStats::SubmitRecord(uint8_t* packet, uint32_t length, uint32_t start,
    uint32_t* e_rcode, uint32_t* e_length, bool is_response)
{
    int rrtype = 0;
    int rrclass = 0;
    unsigned int ttl = 0;
    int ldata = 0;
    int name_start = start;

    record_count++;

    /* Labels are only tabulated in responses, to avoid polluting data with erroneous packets */
    start = SubmitName(packet, length, start, is_response);

    if ((start + 10) > length)
    {
        error_flags |= DNS_REGISTRY_ERROR_FORMAT;
        start = length;
    }
    else
    {
        rrtype = (packet[start] << 8) | packet[start + 1];
        rrclass = (packet[start + 2] << 8) | packet[start + 3];
        ttl = (packet[start + 4] << 24) | (packet[start + 5] << 16)
            | (packet[start + 6] << 8) | packet[start + 7];
        ldata = (packet[start + 8] << 8) | packet[start + 9];

        if (start + ldata + 10 > length)
        {
            error_flags |= DNS_REGISTRY_ERROR_FORMAT;
            start = length;
        }
        else
        {
            SubmitRecordContent(rrtype, rrclass, ttl, ldata, packet + start + 10,
                packet, length, name_start, e_rcode, e_length, is_response);
            start += ldata + 10;
        }
    }

    return start;
}